

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void __thiscall duckdb::FSSTCompressionState::~FSSTCompressionState(FSSTCompressionState *this)

{
  ~FSSTCompressionState(this);
  operator_delete(this);
  return;
}

Assistant:

~FSSTCompressionState() override {
		if (fsst_encoder) {
			duckdb_fsst_destroy(fsst_encoder);
		}
	}